

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void destroy_free<LRQFAstate>(void *temp)

{
  std::__cxx11::string::~string((string *)((long)temp + 8));
  free(temp);
  return;
}

Assistant:

void destroy_free(void* temp)
{
  ((T*)temp)->~T();
  free(temp);
}